

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptance_tests.cpp
# Opt level: O0

Assertion * anon_unknown.dwarf_c87e::parseAssertion(Assertion *__return_storage_ptr__,string *line)

{
  runtime_error *this;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  long local_e0;
  size_type eq;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> rest;
  string local_98;
  value_type local_78;
  long local_60;
  size_t space;
  string local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ctx;
  size_type colon;
  string *line_local;
  Assertion *result;
  
  Assertion::Assertion(__return_storage_ptr__);
  ctx.field_2._8_8_ = std::__cxx11::string::find((char)line,0x3a);
  if (ctx.field_2._8_8_ != -1) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)line);
    do {
      local_60 = std::__cxx11::string::find((char)local_48,0x20);
      std::__cxx11::string::substr((ulong)&local_98,(ulong)local_48);
      parseStep(&local_78,&local_98);
      std::
      vector<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::allocator<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>
      ::push_back(&__return_storage_ptr__->constraints,&local_78);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~vector(&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::substr((ulong)((long)&rest.field_2 + 8),(ulong)local_48);
      std::__cxx11::string::operator=(local_48,(string *)(rest.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(rest.field_2._M_local_buf + 8));
    } while (local_60 != -1);
    std::__cxx11::string::~string(local_48);
  }
  std::__cxx11::string::substr((ulong)&eq,(ulong)line);
  local_e0 = std::__cxx11::string::find((char)&eq,0x3d);
  if (local_e0 != -1) {
    std::__cxx11::string::substr((ulong)&local_120,(ulong)&eq);
    trim(&local_100,&local_120);
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->property,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::substr((ulong)&local_160,(ulong)&eq);
    trim(&local_140,&local_160);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->value,(string *)&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&eq);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Malformed assertion");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Assertion parseAssertion(const std::string &line) {
  Assertion result;
  auto colon = line.find(':');
  if (colon != string::npos) {
    auto ctx = line.substr(0, colon);
    size_t space;
    do {
      space = ctx.find(' ');
      result.constraints.push_back(
        parseStep(ctx.substr(0, space)));
      ctx = ctx.substr(space+1);
    } while (space != string::npos);
  }

  auto rest = line.substr(colon+1);
  auto eq = rest.find('=');
  if (eq == string::npos)
    throw std::runtime_error("Malformed assertion");

  result.property = trim(rest.substr(0, eq));
  result.value = trim(rest.substr(eq+1));

  return result;
}